

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O3

void Amap_CreateRulesTwo(Amap_Lib_t *p,Vec_Int_t *vNods,Vec_Int_t *vNods0,Vec_Int_t *vNods1,int fXor
                        )

{
  int iFan1;
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = vNods0->nSize;
  if (0 < iVar3) {
    uVar2 = (ulong)(uint)vNods1->nSize;
    lVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        iVar3 = vNods0->pArray[lVar6];
        lVar4 = 0;
        do {
          iFan1 = vNods1->pArray[lVar4];
          iVar1 = Amap_LibFindNode(p,iVar3,iFan1,fXor);
          if (iVar1 == -1) {
            iVar1 = Amap_LibCreateNode(p,iVar3,iFan1,fXor);
          }
          if (iVar1 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          if (0 < (long)vNods->nSize) {
            lVar5 = 0;
            do {
              if (vNods->pArray[lVar5] == iVar1 * 2) goto LAB_003cc100;
              lVar5 = lVar5 + 1;
            } while (vNods->nSize != lVar5);
          }
          Vec_IntPush(vNods,iVar1 * 2);
LAB_003cc100:
          lVar4 = lVar4 + 1;
          uVar2 = (ulong)vNods1->nSize;
        } while (lVar4 < (long)uVar2);
        iVar3 = vNods0->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
  }
  return;
}

Assistant:

void Amap_CreateRulesTwo( Amap_Lib_t * p, Vec_Int_t * vNods, Vec_Int_t * vNods0, Vec_Int_t * vNods1, int fXor )
{
    int i, k, iNod, iNod0, iNod1;
    Vec_IntForEachEntry( vNods0, iNod0, i )
    Vec_IntForEachEntry( vNods1, iNod1, k )
    {
        iNod = Amap_LibFindNode( p, iNod0, iNod1, fXor );
        if ( iNod == -1 )
            iNod = Amap_LibCreateNode( p, iNod0, iNod1, fXor );
        Vec_IntPushUnique( vNods, Abc_Var2Lit(iNod, 0) );
    }
}